

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3MinimumFileFormat(Parse *pParse,int iDb,int minFormat)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  Vdbe *p;
  long lVar4;
  int p2;
  int p2_00;
  
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    if (pParse->nTempReg == '\0') {
      p2_00 = pParse->nMem + 1;
      pParse->nMem = p2_00;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      p2_00 = pParse->aTempReg[bVar2];
    }
    if (pParse->nTempReg == '\0') {
      p2 = pParse->nMem + 1;
      pParse->nMem = p2;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      p2 = pParse->aTempReg[bVar2];
    }
    sqlite3VdbeAddOp3(p,0x33,iDb,p2_00,2);
    uVar3 = 1 << ((byte)iDb & 0x1f);
    p->btreeMask = p->btreeMask | uVar3;
    if ((iDb != 1) && ((p->db->aDb[iDb].pBt)->sharable != '\0')) {
      p->lockMask = p->lockMask | uVar3;
    }
    sqlite3VdbeAddOp3(p,0x19,minFormat,p2,0);
    uVar3 = sqlite3VdbeAddOp3(p,0x53,p2,0,p2_00);
    if (p->aOp != (Op *)0x0) {
      p->aOp[(long)p->nOp + -1].p5 = 0x90;
    }
    sqlite3VdbeAddOp3(p,0x34,iDb,2,p2);
    uVar1 = p->nOp;
    if (uVar3 < uVar1) {
      p->aOp[uVar3].p2 = uVar1;
    }
    p->pParse->iFixedOp = uVar1 - 1;
    if (p2_00 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        lVar4 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar4) == p2_00) {
            (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
            goto LAB_00170fb6;
          }
          lVar4 = lVar4 + 0x14;
        } while ((int)lVar4 != 200);
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = p2_00;
      }
    }
LAB_00170fb6:
    if (p2 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        lVar4 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar4) == p2) {
            (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
            return;
          }
          lVar4 = lVar4 + 0x14;
        } while ((int)lVar4 != 200);
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = p2;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MinimumFileFormat(Parse *pParse, int iDb, int minFormat){
  Vdbe *v;
  v = sqlite3GetVdbe(pParse);
  /* The VDBE should have been allocated before this routine is called.
  ** If that allocation failed, we would have quit before reaching this
  ** point */
  if( ALWAYS(v) ){
    int r1 = sqlite3GetTempReg(pParse);
    int r2 = sqlite3GetTempReg(pParse);
    int j1;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, r1, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    sqlite3VdbeAddOp2(v, OP_Integer, minFormat, r2);
    j1 = sqlite3VdbeAddOp3(v, OP_Ge, r2, 0, r1);
    sqlite3VdbeChangeP5(v, SQLITE_NOTNULL); VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, r2);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
}